

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O1

bool bssl::anon_unknown_1::NormalizeValue
               (X509NameAttribute attribute,string *output,CertErrors *errors)

{
  bool bVar1;
  CharsetEnforcement charset_enforcement;
  long *local_30;
  long *local_28;
  
  if (errors == (CertErrors *)0x0) {
    abort();
  }
  bVar1 = X509NameAttribute::ValueAsStringUnsafe(&attribute,output);
  if (!bVar1) {
    CreateCertErrorParams1SizeT((bssl *)&local_28,"tag",(ulong)attribute.value_tag);
    CertErrors::AddError
              (errors,"Failed converting AttributeValue to string",
               (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> *)
               &local_28);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
    return false;
  }
  bVar1 = false;
  if ((int)attribute.value_tag < 0x16) {
    if (attribute.value_tag == 0xc) goto LAB_004c4d5a;
    charset_enforcement = ENFORCE_PRINTABLE_STRING;
    bVar1 = false;
    if (attribute.value_tag != 0x13) goto LAB_004c4d6d;
  }
  else if (attribute.value_tag == 0x16) {
    charset_enforcement = ENFORCE_ASCII;
  }
  else {
    if ((attribute.value_tag != 0x1e) && (attribute.value_tag != 0x1c)) goto LAB_004c4d6d;
LAB_004c4d5a:
    charset_enforcement = NO_ENFORCEMENT;
  }
  bVar1 = NormalizeDirectoryString(charset_enforcement,output);
LAB_004c4d6d:
  if (bVar1 == false) {
    CreateCertErrorParams1SizeT((bssl *)&local_30,"tag",(ulong)attribute.value_tag);
    CertErrors::AddError
              (errors,"Failed normalizing string",
               (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> *)
               &local_30);
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool NormalizeValue(X509NameAttribute attribute,
                                  std::string *output, CertErrors *errors) {
  BSSL_CHECK(errors);

  if (!attribute.ValueAsStringUnsafe(output)) {
    errors->AddError(kFailedConvertingAttributeValue,
                     CreateCertErrorParams1SizeT("tag", attribute.value_tag));
    return false;
  }

  bool success = false;
  switch (attribute.value_tag) {
    case CBS_ASN1_PRINTABLESTRING:
      success = NormalizeDirectoryString(ENFORCE_PRINTABLE_STRING, output);
      break;
    case CBS_ASN1_BMPSTRING:
    case CBS_ASN1_UNIVERSALSTRING:
    case CBS_ASN1_UTF8STRING:
      success = NormalizeDirectoryString(NO_ENFORCEMENT, output);
      break;
    case CBS_ASN1_IA5STRING:
      success = NormalizeDirectoryString(ENFORCE_ASCII, output);
      break;
    default:
      // NOTREACHED
      success = false;
      break;
  }

  if (!success) {
    errors->AddError(kFailedNormalizingString,
                     CreateCertErrorParams1SizeT("tag", attribute.value_tag));
  }

  return success;
}